

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple.h
# Opt level: O2

void __thiscall Multiple_Simple_Test::TestBody(Multiple_Simple_Test *this)

{
  char *pcVar1;
  undefined1 local_150 [8];
  BigNumber num_1;
  undefined1 local_108 [8];
  BigNumber num_2;
  BigNumber num_3;
  BigNumber num_4;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  allocator local_41;
  BigNumber local_40;
  allocator local_11;
  
  std::__cxx11::string::string((string *)&num_3.m_symbol,"1",(allocator *)local_70);
  BigNumber::BigNumber((BigNumber *)local_108,(string *)&num_3.m_symbol);
  std::__cxx11::string::string((string *)&local_40,"1",(allocator *)&num_4.m_symbol);
  BigNumber::BigNumber((BigNumber *)&num_2.m_symbol,(string *)&local_40);
  BigNumber::operator*((BigNumber *)local_150,(BigNumber *)local_108,(BigNumber *)&num_2.m_symbol);
  BigNumber::~BigNumber((BigNumber *)&num_2.m_symbol);
  std::__cxx11::string::~string((string *)&local_40);
  BigNumber::~BigNumber((BigNumber *)local_108);
  std::__cxx11::string::~string((string *)&num_3.m_symbol);
  std::__cxx11::string::string((string *)&local_40,"1",(allocator *)&num_4.m_symbol);
  BigNumber::BigNumber((BigNumber *)&num_2.m_symbol,(string *)&local_40);
  std::__cxx11::string::string((string *)local_70,"-1",(allocator *)&num_1.m_symbol);
  BigNumber::BigNumber((BigNumber *)&num_3.m_symbol,(string *)local_70);
  BigNumber::operator*
            ((BigNumber *)local_108,(BigNumber *)&num_2.m_symbol,(BigNumber *)&num_3.m_symbol);
  BigNumber::~BigNumber((BigNumber *)&num_3.m_symbol);
  std::__cxx11::string::~string((string *)local_70);
  BigNumber::~BigNumber((BigNumber *)&num_2.m_symbol);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)local_70,"-1",(allocator *)&num_1.m_symbol);
  BigNumber::BigNumber((BigNumber *)&num_3.m_symbol,(string *)local_70);
  std::__cxx11::string::string((string *)&num_4.m_symbol,"1",&local_11);
  BigNumber::BigNumber(&local_40,(string *)&num_4.m_symbol);
  BigNumber::operator*((BigNumber *)&num_2.m_symbol,(BigNumber *)&num_3.m_symbol,&local_40);
  BigNumber::~BigNumber(&local_40);
  std::__cxx11::string::~string((string *)&num_4.m_symbol);
  BigNumber::~BigNumber((BigNumber *)&num_3.m_symbol);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::string((string *)&num_4.m_symbol,"-1",&local_11);
  BigNumber::BigNumber(&local_40,(string *)&num_4.m_symbol);
  std::__cxx11::string::string((string *)&num_1.m_symbol,"-1",&local_41);
  BigNumber::BigNumber((BigNumber *)local_70,(string *)&num_1.m_symbol);
  BigNumber::operator*((BigNumber *)&num_3.m_symbol,&local_40,(BigNumber *)local_70);
  BigNumber::~BigNumber((BigNumber *)local_70);
  std::__cxx11::string::~string((string *)&num_1.m_symbol);
  BigNumber::~BigNumber(&local_40);
  std::__cxx11::string::~string((string *)&num_4.m_symbol);
  BigNumber::toString_abi_cxx11_((string *)&local_40,(BigNumber *)local_150);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)local_70,"\"1\"","num_1.toString()",(char (*) [2])0x34dbd2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (local_70[0] == (allocator)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&num_4.m_symbol,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/multiple.h"
               ,0x19,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&num_4.m_symbol,(Message *)&local_40)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&num_4.m_symbol);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  BigNumber::toString_abi_cxx11_((string *)&local_40,(BigNumber *)local_108);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)local_70,"\"-1\"","num_2.toString()",(char (*) [3])0x34dbd1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (local_70[0] == (allocator)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&num_4.m_symbol,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/multiple.h"
               ,0x1a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&num_4.m_symbol,(Message *)&local_40)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&num_4.m_symbol);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  BigNumber::toString_abi_cxx11_((string *)&local_40,(BigNumber *)&num_2.m_symbol);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)local_70,"\"-1\"","num_3.toString()",(char (*) [3])0x34dbd1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (local_70[0] == (allocator)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&num_4.m_symbol,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/multiple.h"
               ,0x1b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&num_4.m_symbol,(Message *)&local_40)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&num_4.m_symbol);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  BigNumber::toString_abi_cxx11_((string *)&local_40,(BigNumber *)&num_3.m_symbol);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)local_70,"\"1\"","num_4.toString()",(char (*) [2])0x34dbd2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (local_70[0] == (allocator)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&num_4.m_symbol,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/multiple.h"
               ,0x1c,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&num_4.m_symbol,(Message *)&local_40)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&num_4.m_symbol);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  BigNumber::~BigNumber((BigNumber *)&num_3.m_symbol);
  BigNumber::~BigNumber((BigNumber *)&num_2.m_symbol);
  BigNumber::~BigNumber((BigNumber *)local_108);
  BigNumber::~BigNumber((BigNumber *)local_150);
  return;
}

Assistant:

TEST(Multiple, Simple)
{
    BigNumber num_1 = BigNumber("1") * BigNumber("1");
    BigNumber num_2 = BigNumber("1") * BigNumber("-1");
    BigNumber num_3 = BigNumber("-1") * BigNumber("1");
    BigNumber num_4 = BigNumber("-1") * BigNumber("-1");
    EXPECT_EQ("1", num_1.toString());
    EXPECT_EQ("-1", num_2.toString());
    EXPECT_EQ("-1", num_3.toString());
    EXPECT_EQ("1", num_4.toString());
}